

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_2x2_pack4.h
# Opt level: O0

void ncnn::pooling2x2s2_max_pack4_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  int iVar6;
  long *in_RSI;
  long *in_RDI;
  __m128 _max;
  __m128 _max1;
  __m128 _max0;
  __m128 _r11;
  __m128 _r10;
  __m128 _r01;
  __m128 _r00;
  int j;
  int i;
  float *r1;
  float *r0;
  float *outptr;
  Mat img0;
  int q;
  int tailstep;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  int local_330;
  int local_32c;
  undefined1 (*local_328) [16];
  undefined1 (*local_320) [16];
  undefined8 *local_2c0;
  int local_270;
  
  lVar4 = in_RDI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar5 = in_RSI[6];
  iVar6 = (*(int *)((long)in_RDI + 0x2c) * 2 + iVar1 * -2) * 4;
  for (local_270 = 0; local_270 < (int)lVar4; local_270 = local_270 + 1) {
    local_320 = (undefined1 (*) [16])(*in_RDI + in_RDI[8] * (long)local_270 * in_RDI[2]);
    local_2c0 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_270 * in_RSI[2]);
    local_328 = (undefined1 (*) [16])(*local_320 + (long)*(int *)((long)in_RDI + 0x2c) * in_RDI[2]);
    for (local_32c = 0; local_32c < (int)lVar5; local_32c = local_32c + 1) {
      for (local_330 = 0; local_330 < iVar1; local_330 = local_330 + 1) {
        auVar2 = vmaxps_avx(*local_320,local_320[1]);
        auVar3 = vmaxps_avx(*local_328,local_328[1]);
        auVar2 = vmaxps_avx(auVar2,auVar3);
        local_3a8 = auVar2._0_8_;
        uStack_3a0 = auVar2._8_8_;
        *local_2c0 = local_3a8;
        local_2c0[1] = uStack_3a0;
        local_320 = local_320 + 2;
        local_328 = local_328 + 2;
        local_2c0 = local_2c0 + 2;
      }
      local_320 = (undefined1 (*) [16])(*local_320 + (long)iVar6 * 4);
      local_328 = (undefined1 (*) [16])(*local_328 + (long)iVar6 * 4);
    }
  }
  return;
}

Assistant:

static void pooling2x2s2_max_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 4;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);

                __m128 _max0 = _mm_max_ps(_r00, _r01);
                __m128 _max1 = _mm_max_ps(_r10, _r11);
                __m128 _max = _mm_max_ps(_max0, _max1);

                _mm_storeu_ps(outptr, _max);

                r0 += 8;
                r1 += 8;
                outptr += 4;
            }

            r0 += tailstep;
            r1 += tailstep;
        }
    }
}